

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

void build_backtrace(JSContext *ctx,JSValue error_obj,char *filename,int line_num,
                    int backtrace_flags)

{
  long lVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  JSStackFrame *pJVar5;
  long lVar6;
  void *pvVar7;
  JSValue setter;
  JSValue this_obj;
  JSValue this_obj_00;
  JSValue this_obj_01;
  JSContext *pJVar8;
  JSContext *pJVar9;
  uint uVar10;
  size_t sVar11;
  char *pcVar12;
  byte bVar13;
  uint uVar14;
  ulong uVar15;
  JSValueUnion *pJVar16;
  char *pcVar17;
  byte *buf_end;
  byte *buf;
  uint uVar18;
  uint uVar19;
  uint *puVar20;
  uint uVar21;
  uint uVar22;
  byte *pbVar23;
  bool bVar24;
  JSValue JVar25;
  JSValue val1;
  JSValue val;
  DynBuf dbuf;
  uint local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  JSValueUnion local_88;
  int64_t local_80;
  JSContext *local_78;
  DynBuf local_70;
  undefined4 local_40;
  uint uStack_3c;
  undefined8 uStack_38;
  
  local_80 = error_obj.tag;
  local_88 = error_obj.u;
  dbuf_init2(&local_70,ctx->rt,js_realloc_rt);
  if (filename != (char *)0x0) {
    dbuf_printf(&local_70,"    at %s",filename);
    if (line_num != -1) {
      dbuf_printf(&local_70,":%d",CONCAT44(0,line_num));
    }
    dbuf_putc(&local_70,'\n');
    sVar11 = strlen(filename);
    JVar25 = JS_NewStringLen(ctx,filename,sVar11);
    this_obj_00.tag = local_80;
    this_obj_00.u.ptr = local_88.ptr;
    this_obj.tag = local_80;
    this_obj.u.ptr = local_88.ptr;
    JS_DefinePropertyValue(ctx,this_obj,0x31,JVar25,3);
    uVar21 = local_98._4_4_;
    local_98 = (void *)((ulong)local_98._4_4_ << 0x20);
    uStack_90 = 3;
    local_40 = 0;
    uStack_38 = 3;
    JVar25.tag = 3;
    JVar25.u.ptr = (void *)((ulong)uVar21 << 0x20);
    setter.tag = 3;
    setter.u.ptr = (void *)((ulong)uStack_3c << 0x20);
    val.tag = 0;
    val.u = (JSValueUnion)CONCAT44(0,line_num);
    JS_DefineProperty(ctx,this_obj_00,0x32,val,JVar25,setter,0x2703);
    pJVar8 = local_78;
    if ((backtrace_flags & 2U) != 0) goto LAB_0012b58a;
  }
  pJVar9 = ctx;
  pJVar8 = local_78;
  for (pJVar5 = ctx->rt->current_stack_frame; local_78 = pJVar9, pJVar5 != (JSStackFrame *)0x0;
      pJVar5 = pJVar5->prev_frame) {
    uVar21 = 0;
    if ((backtrace_flags & 1U) == 0) {
      local_98 = (pJVar5->cur_func).u.ptr;
      if ((int)(pJVar5->cur_func).tag == -1) {
        lVar6 = *(long *)((long)local_98 + 0x18);
        uVar21 = *(uint *)(lVar6 + (long)(int)(~*(uint *)(lVar6 + 0x20) | 0xffffffc9) * 4);
        if (uVar21 == 0) {
          pJVar16 = (JSValueUnion *)0x0;
          puVar20 = (uint *)0x0;
        }
        else {
          do {
            lVar1 = lVar6 + 0x40 + (ulong)uVar21 * 8;
            puVar20 = (uint *)(lVar1 + -8);
            if (*(int *)(lVar1 + -4) == 0x36) {
              pJVar16 = (JSValueUnion *)
                        (((ulong)uVar21 - 1) * 0x10 + *(long *)((long)local_98 + 0x20));
              break;
            }
            uVar21 = *puVar20;
            pJVar16 = (JSValueUnion *)0x0;
            puVar20 = (uint *)0x0;
            uVar21 = uVar21 & 0x3ffffff;
          } while (uVar21 != 0);
        }
        if (((puVar20 == (uint *)0x0) || (0x3fffffff < *puVar20)) || (pJVar16[1].int32 != -7))
        goto LAB_0012b2ec;
        val1.tag = (int64_t)pJVar16[1].ptr;
        val1.u.ptr = pJVar16->ptr;
        pcVar12 = JS_ToCStringLen2(ctx,(size_t *)0x0,val1,0);
      }
      else {
LAB_0012b2ec:
        pcVar12 = (char *)0x0;
      }
      pcVar17 = "<anonymous>";
      if ((pcVar12 != (char *)0x0) && (pcVar17 = pcVar12, *pcVar12 == '\0')) {
        pcVar17 = "<anonymous>";
      }
      dbuf_printf(&local_70,"    at %s",pcVar17);
      JS_FreeCString(ctx,pcVar12);
      pvVar7 = (pJVar5->cur_func).u.ptr;
      uVar15 = (ulong)*(ushort *)((long)pvVar7 + 6);
      uVar21 = backtrace_flags;
      if ((uVar15 < 0x32) && ((0x2200000012000U >> (uVar15 & 0x3f) & 1) != 0)) {
        lVar6 = *(long *)((long)pvVar7 + 0x30);
        uVar2 = *(ushort *)(lVar6 + 0x19);
        if ((uVar2 >> 10 & 1) != 0) {
          pbVar23 = *(byte **)(lVar6 + 0x70);
          if (pbVar23 == (byte *)0x0) {
            uVar14 = 0xffffffff;
          }
          else {
            uVar3 = *(uint *)(lVar6 + 0x20);
            iVar4 = *(int *)&pJVar5->cur_pc;
            buf_end = pbVar23 + *(int *)(lVar6 + 0x6c);
            uVar10 = 0;
            uVar19 = *(uint *)(lVar6 + 100);
            do {
              uVar18 = uVar19;
              uVar14 = uVar18;
              if (buf_end <= pbVar23) break;
              buf = pbVar23 + 1;
              if (*pbVar23 == 0) {
                uVar14 = 0xffffffff;
                if (buf < buf_end) {
                  bVar13 = 0;
                  uVar22 = 0;
                  uVar19 = 0;
                  pbVar23 = pbVar23 + 2;
                  do {
                    uVar19 = (pbVar23[-1] & 0x7f) << (bVar13 & 0x1f) | uVar19;
                    if (-1 < (char)pbVar23[-1]) {
                      uVar14 = uVar22 + 1;
                      goto LAB_0012b41b;
                    }
                    if (3 < uVar22) {
                      uVar19 = 0;
                      goto LAB_0012b41b;
                    }
                    uVar22 = uVar22 + 1;
                    bVar13 = bVar13 + 7;
                    bVar24 = pbVar23 < buf_end;
                    pbVar23 = pbVar23 + 1;
                  } while (bVar24);
                }
                uVar19 = 0;
                uVar14 = 0xffffffff;
LAB_0012b41b:
                if ((int)uVar14 < 0) {
LAB_0012b421:
                  local_a0 = *(uint *)(lVar6 + 100);
                  bVar24 = false;
                  uVar19 = uVar18;
                }
                else {
                  uVar10 = uVar19 + uVar10;
                  buf = buf + uVar14;
                  uVar14 = get_sleb128((int32_t *)&local_98,buf,buf_end);
                  if ((int)uVar14 < 0) goto LAB_0012b421;
                  buf = buf + uVar14;
                  uVar19 = (int)local_98 + uVar18;
                  bVar24 = true;
                }
                uVar14 = local_a0;
                if (!bVar24) break;
              }
              else {
                uVar14 = *pbVar23 - 1;
                uVar10 = uVar10 + uVar14 / 5;
                uVar19 = (uVar18 + uVar14 % 5) - 1;
              }
              pbVar23 = buf;
              uVar14 = uVar18;
            } while (uVar10 <= ~uVar3 + iVar4);
          }
          ctx = local_78;
          pcVar17 = JS_AtomToCString(local_78,*(JSAtom *)(lVar6 + 0x60));
          pcVar12 = pcVar17;
          if (pcVar17 == (char *)0x0) {
            pcVar12 = "<null>";
          }
          dbuf_printf(&local_70," (%s",pcVar12);
          JS_FreeCString(ctx,pcVar17);
          if (uVar14 != 0xffffffff) {
            dbuf_printf(&local_70,":%d",(ulong)uVar14);
          }
          dbuf_putc(&local_70,')');
        }
        dbuf_putc(&local_70,'\n');
        pJVar8 = local_78;
        if ((uVar2 >> 0xb & 1) != 0) break;
      }
      else {
        dbuf_printf(&local_70," (native)");
        dbuf_putc(&local_70,'\n');
      }
    }
    pJVar9 = local_78;
    backtrace_flags = uVar21;
    pJVar8 = local_78;
  }
LAB_0012b58a:
  local_78 = pJVar8;
  dbuf_putc(&local_70,'\0');
  if (local_70.error == 0) {
    sVar11 = strlen((char *)local_70.buf);
    JVar25 = JS_NewStringLen(ctx,(char *)local_70.buf,sVar11);
  }
  else {
    JVar25 = (JSValue)(ZEXT816(2) << 0x40);
  }
  dbuf_free(&local_70);
  this_obj_01.tag = local_80;
  this_obj_01.u.float64 = local_88.float64;
  JS_DefinePropertyValue(ctx,this_obj_01,0x35,JVar25,3);
  return;
}

Assistant:

static void build_backtrace(JSContext *ctx, JSValueConst error_obj,
                            const char *filename, int line_num,
                            int backtrace_flags)
{
    JSStackFrame *sf;
    JSValue str;
    DynBuf dbuf;
    const char *func_name_str;
    const char *str1;
    JSObject *p;
    BOOL backtrace_barrier;
    
    js_dbuf_init(ctx, &dbuf);
    if (filename) {
        dbuf_printf(&dbuf, "    at %s", filename);
        if (line_num != -1)
            dbuf_printf(&dbuf, ":%d", line_num);
        dbuf_putc(&dbuf, '\n');
        str = JS_NewString(ctx, filename);
        JS_DefinePropertyValue(ctx, error_obj, JS_ATOM_fileName, str,
                               JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE);
        JS_DefinePropertyValue(ctx, error_obj, JS_ATOM_lineNumber, JS_NewInt32(ctx, line_num),
                               JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE);
        if (backtrace_flags & JS_BACKTRACE_FLAG_SINGLE_LEVEL)
            goto done;
    }
    for(sf = ctx->rt->current_stack_frame; sf != NULL; sf = sf->prev_frame) {
        if (backtrace_flags & JS_BACKTRACE_FLAG_SKIP_FIRST_LEVEL) {
            backtrace_flags &= ~JS_BACKTRACE_FLAG_SKIP_FIRST_LEVEL;
            continue;
        }
        func_name_str = get_func_name(ctx, sf->cur_func);
        if (!func_name_str || func_name_str[0] == '\0')
            str1 = "<anonymous>";
        else
            str1 = func_name_str;
        dbuf_printf(&dbuf, "    at %s", str1);
        JS_FreeCString(ctx, func_name_str);

        p = JS_VALUE_GET_OBJ(sf->cur_func);
        backtrace_barrier = FALSE;
        if (js_class_has_bytecode(p->class_id)) {
            JSFunctionBytecode *b;
            const char *atom_str;
            int line_num1;

            b = p->u.func.function_bytecode;
            backtrace_barrier = b->backtrace_barrier;
            if (b->has_debug) {
                line_num1 = find_line_num(ctx, b,
                                          sf->cur_pc - b->byte_code_buf - 1);
                atom_str = JS_AtomToCString(ctx, b->debug.filename);
                dbuf_printf(&dbuf, " (%s",
                            atom_str ? atom_str : "<null>");
                JS_FreeCString(ctx, atom_str);
                if (line_num1 != -1)
                    dbuf_printf(&dbuf, ":%d", line_num1);
                dbuf_putc(&dbuf, ')');
            }
        } else {
            dbuf_printf(&dbuf, " (native)");
        }
        dbuf_putc(&dbuf, '\n');
        /* stop backtrace if JS_EVAL_FLAG_BACKTRACE_BARRIER was used */
        if (backtrace_barrier)
            break;
    }
 done:
    dbuf_putc(&dbuf, '\0');
    if (dbuf_error(&dbuf))
        str = JS_NULL;
    else
        str = JS_NewString(ctx, (char *)dbuf.buf);
    dbuf_free(&dbuf);
    JS_DefinePropertyValue(ctx, error_obj, JS_ATOM_stack, str,
                           JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE);
}